

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttt.cpp
# Opt level: O0

void __thiscall ttt::Board::Print(Board *this)

{
  int iVar1;
  ostream *poVar2;
  byte *pbVar3;
  long in_RDI;
  int j;
  int i;
  size_type in_stack_ffffffffffffffd8;
  array<std::array<unsigned_char,_3UL>,_3UL> *in_stack_ffffffffffffffe0;
  int local_10;
  int local_c;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Player to move: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)*(char *)(in_RDI + 9));
  std::operator<<(poVar2,'\n');
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                         (in_stack_ffffffffffffffe0->_M_elems,in_stack_ffffffffffffffd8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*pbVar3);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Status: ");
  iVar1 = GetStatus((Board *)0x24dca7);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n\n");
  return;
}

Assistant:

void
Board::Print() const
{
    std::cout << "Player to move: " << static_cast<int>(player) << '\n';
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
            std::cout << static_cast<int>(board[i][j]) << ' ';
        std::cout << '\n';
    }
    std::cout << "Status: " << GetStatus() << "\n\n";
}